

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O0

string * __thiscall
google::protobuf::util::(anonymous_namespace)::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  int32_t x;
  uint32_t x_00;
  Type TVar3;
  int64_t x_01;
  uint64_t x_02;
  char *__s;
  DescriptorStringView psVar4;
  EnumValueDescriptor *this_00;
  LogMessage *pLVar5;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  float value;
  double value_00;
  allocator<char> local_119;
  LogMessageDebugFatal local_118 [23];
  Voidify local_101;
  undefined1 local_100 [16];
  allocator<char> local_d9;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  AlphaNum local_48;
  FieldDescriptor *local_18;
  FieldDescriptor *descriptor_local;
  
  local_18 = (FieldDescriptor *)this;
  descriptor_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  switch(CVar2) {
  case CPPTYPE_INT32:
    x = FieldDescriptor::default_value_int32(local_18);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_48,x);
    absl::lts_20240722::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20240722 *)&local_48,a);
    break;
  case CPPTYPE_INT64:
    x_01 = FieldDescriptor::default_value_int64(local_18);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_78,x_01);
    absl::lts_20240722::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20240722 *)&local_78,a_00);
    break;
  case CPPTYPE_UINT32:
    x_00 = FieldDescriptor::default_value_uint32(local_18);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_a8,x_00);
    absl::lts_20240722::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20240722 *)&local_a8,a_01);
    break;
  case CPPTYPE_UINT64:
    x_02 = FieldDescriptor::default_value_uint64(local_18);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_d8,x_02);
    absl::lts_20240722::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20240722 *)&local_d8,a_02);
    break;
  case CPPTYPE_DOUBLE:
    value_00 = FieldDescriptor::default_value_double(local_18);
    io::SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(io *)this,value_00);
    break;
  case CPPTYPE_FLOAT:
    value = FieldDescriptor::default_value_float(local_18);
    io::SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(io *)this,value);
    break;
  case CPPTYPE_BOOL:
    bVar1 = FieldDescriptor::default_value_bool(local_18);
    __s = "false";
    if (bVar1) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_d9);
    std::allocator<char>::~allocator(&local_d9);
    break;
  case CPPTYPE_ENUM:
    this_00 = FieldDescriptor::default_value_enum(local_18);
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
    break;
  case CPPTYPE_STRING:
    TVar3 = FieldDescriptor::type(local_18);
    if (TVar3 == TYPE_BYTES) {
      psVar4 = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
      local_100 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      absl::lts_20240722::CEscape_abi_cxx11_(__return_storage_ptr__,local_100._0_8_,local_100._8_8_)
      ;
    }
    else {
      psVar4 = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
    }
    break;
  case CPPTYPE_MESSAGE:
    absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              (local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/type_resolver_util.cc"
               ,0xd0);
    pLVar5 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_118);
    pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar5,(char (*) [36])"Messages can\'t have default values!");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_101,pLVar5);
    absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal(local_118);
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_119);
    std::allocator<char>::~allocator(&local_119);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValueAsString(const FieldDescriptor& descriptor) {
  switch (descriptor.cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return absl::StrCat(descriptor.default_value_int32());
      break;
    case FieldDescriptor::CPPTYPE_INT64:
      return absl::StrCat(descriptor.default_value_int64());
      break;
    case FieldDescriptor::CPPTYPE_UINT32:
      return absl::StrCat(descriptor.default_value_uint32());
      break;
    case FieldDescriptor::CPPTYPE_UINT64:
      return absl::StrCat(descriptor.default_value_uint64());
      break;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return io::SimpleFtoa(descriptor.default_value_float());
      break;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return io::SimpleDtoa(descriptor.default_value_double());
      break;
    case FieldDescriptor::CPPTYPE_BOOL:
      return descriptor.default_value_bool() ? "true" : "false";
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      if (descriptor.type() == FieldDescriptor::TYPE_BYTES) {
        return absl::CEscape(descriptor.default_value_string());
      } else {
        return std::string(descriptor.default_value_string());
      }
      break;
    case FieldDescriptor::CPPTYPE_ENUM:
      return std::string(descriptor.default_value_enum()->name());
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      ABSL_DLOG(FATAL) << "Messages can't have default values!";
      break;
  }
  return "";
}